

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isResultInSet(CmpResultSet resultSet,float result,int resultBits)

{
  bool bVar1;
  float fVar2;
  bool local_22;
  float maxR;
  float minR;
  float err;
  int resultBits_local;
  float result_local;
  CmpResultSet resultSet_local;
  
  fVar2 = TexVerifierUtil::computeFixedPointError(resultBits);
  if ((((ushort)resultSet & 1) != 0) &&
     (bVar1 = de::inRange<float>(1.0,result - fVar2,result + fVar2), bVar1)) {
    return true;
  }
  local_22 = false;
  if (((ushort)resultSet & 0x100) != 0) {
    local_22 = de::inRange<float>(0.0,result - fVar2,result + fVar2);
  }
  return local_22;
}

Assistant:

static inline bool isResultInSet (const CmpResultSet resultSet, const float result, const int resultBits)
{
	const float err		= computeFixedPointError(resultBits);
	const float	minR	= result-err;
	const float	maxR	= result+err;

	return (resultSet.isTrue	&& de::inRange(1.0f, minR, maxR)) ||
		   (resultSet.isFalse	&& de::inRange(0.0f, minR, maxR));
}